

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Unspill(CWriter *this,TypeVector *types)

{
  Type type;
  byte bVar1;
  pointer pTVar2;
  const_reference pvVar3;
  pointer pTVar4;
  uint uVar5;
  long lVar6;
  StackVar local_38;
  
  pTVar4 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)pTVar2 - (long)pTVar4 >> 3;
  if (lVar6 == 1) {
    local_38.index = (int)((ulong)((long)pTVar2 - (long)pTVar4) >> 3) - 1;
    local_38.type.enum_ = Any;
    local_38.type.type_index_ = 0;
    Write(this,&local_38);
    WriteData(this," = tmp;",7);
    Write(this);
  }
  else {
    if (lVar6 == 0) {
      __assert_fail("types.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0xbb5,
                    "void wabt::(anonymous namespace)::CWriter::Unspill(const TypeVector &, const targets &) [targets = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:3012:18)]"
                   );
    }
    uVar5 = 0;
    while( true ) {
      if ((ulong)((long)pTVar2 - (long)pTVar4 >> 3) <= (ulong)uVar5) break;
      local_38.index = (int)((ulong)((long)pTVar2 - (long)pTVar4) >> 3) + ~uVar5;
      local_38.type.enum_ = Any;
      local_38.type.type_index_ = 0;
      Write(this,&local_38);
      pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::at(types,(ulong)uVar5);
      type.enum_ = pvVar3->enum_;
      type.type_index_ = pvVar3->type_index_;
      bVar1 = MangleType(type);
      Writef(this," = tmp.%c%d;",(ulong)bVar1,(ulong)uVar5);
      Write(this);
      uVar5 = uVar5 + 1;
      pTVar4 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  return;
}

Assistant:

void CWriter::Unspill(const TypeVector& types) {
  Unspill(types, [&](auto i) { return StackVar(types.size() - i - 1); });
}